

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populationTest.cpp
# Opt level: O2

int main(void)

{
  SpikingPopulation *this;
  SpikingPopulation *this_00;
  NoEvent *pNVar1;
  Clock *this_01;
  SpikeEvent *this_02;
  int iVar2;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  this = (SpikingPopulation *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"izhikevich",&local_71);
  SpikingPopulation::SpikingPopulation(this,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (SpikingPopulation *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CurrentGenerator",&local_71);
  SpikingPopulation::SpikingPopulation(this_00,1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pNVar1 = (NoEvent *)operator_new(0x18);
  NoEvent::NoEvent(pNVar1);
  this_01 = Clock::getInstance();
  Clock::setDt(this_01,0.01);
  for (iVar2 = 0; iVar2 != 1000; iVar2 = iVar2 + 1) {
    Clock::tick(this_01);
    if (iVar2 == 600) {
      pNVar1 = (NoEvent *)operator_new(0x18);
      NoEvent::NoEvent(pNVar1);
    }
    else if (iVar2 == 100) {
      this_02 = (SpikeEvent *)operator_new(0x28);
      SpikeEvent::SpikeEvent(this_02);
      this_02->multiplicity = 1;
      this_02->weight = 1.0;
    }
    (**(this_00->super_Population)._vptr_Population)(this_00);
    (*(this->super_Population)._vptr_Population[5])
              (this,0,*(this_00->super_Population).output.
                       super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
    (**(this->super_Population)._vptr_Population)(this);
  }
  return 0;
}

Assistant:

int main() 
{
    SpikingPopulation* p1 = new SpikingPopulation(1, "izhikevich");
    SpikingPopulation* p2 = new SpikingPopulation(1, "CurrentGenerator");

    Event* e = new NoEvent();

    Clock* clock = Clock::getInstance();
    clock->setDt(0.01);

    for(int i = 0; i < 1000; i++) {
        clock->tick();
        if(i == 100) {
            e = new SpikeEvent();
            static_cast<SpikeEvent*>(e)->multiplicity = 1;
            static_cast<SpikeEvent*>(e)->weight = 1.0;
        }
        else if(i == 600) {
            e = new NoEvent();
        }
        p2->update();

        p1->setInput(0, p2->output[0]);
        p1->update();

    }
    return 0;
}